

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_delete.cpp
# Opt level: O2

void __thiscall duckdb::LogicalDelete::ResolveTypes(LogicalDelete *this)

{
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> vStack_28;
  
  if (this->return_chunk == true) {
    TableCatalogEntry::GetTypes((vector<duckdb::LogicalType,_true> *)&vStack_28,this->table);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::_M_move_assign
              (&(this->super_LogicalOperator).types.
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,&vStack_28);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&vStack_28);
    return;
  }
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)
             &(this->super_LogicalOperator).types,&LogicalType::BIGINT);
  return;
}

Assistant:

void LogicalDelete::ResolveTypes() {
	if (return_chunk) {
		types = table.GetTypes();
	} else {
		types.emplace_back(LogicalType::BIGINT);
	}
}